

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonResult(JsonString *p)

{
  code *xDel;
  JsonString *p_local;
  
  if (p->bErr == '\0') {
    xDel = sqlite3_free;
    if (p->bStatic != '\0') {
      xDel = (_func_void_void_ptr *)0xffffffffffffffff;
    }
    sqlite3_result_text64(p->pCtx,p->zBuf,p->nUsed,xDel,'\x01');
    jsonZero(p);
  }
  return;
}

Assistant:

static void jsonResult(JsonString *p){
  if( p->bErr==0 ){
    sqlite3_result_text64(p->pCtx, p->zBuf, p->nUsed,
                          p->bStatic ? SQLITE_TRANSIENT : sqlite3_free,
                          SQLITE_UTF8);
    jsonZero(p);
  }
  assert( p->bStatic );
}